

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<TFad<6,_double>_>::Decompose_LU(TPZMatrix<TFad<6,_double>_> *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined **local_198;
  double local_190;
  undefined **local_188;
  double adStack_180 [5];
  undefined **local_158;
  double local_150;
  double adStack_148 [6];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f0 [8];
  double local_e8;
  double adStack_e0 [6];
  undefined1 local_b0 [8];
  double local_a8;
  double adStack_a0 [8];
  double local_60 [6];
  
  bVar6 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar6) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar6 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar6 == 0) {
    local_158 = &PTR__TFad_01835938;
    local_150 = 0.0;
    adStack_148[0] = 0.0;
    adStack_148[1] = 0.0;
    adStack_148[2] = 0.0;
    adStack_148[3] = 0.0;
    adStack_148[4] = 0.0;
    adStack_148[5] = 0.0;
    lVar9 = (this->super_TPZBaseMatrix).fRow;
    lVar10 = (this->super_TPZBaseMatrix).fCol;
    if (lVar10 < lVar9) {
      lVar9 = lVar10;
    }
    if (0 < lVar9) {
      lVar10 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_198,this,lVar10,lVar10);
        dVar5 = local_190;
        local_60[4] = adStack_180[3];
        local_60[5] = adStack_180[4];
        local_60[2] = adStack_180[1];
        local_60[3] = adStack_180[2];
        local_60[0] = (double)local_188;
        local_60[1] = adStack_180[0];
        if (ABS(local_190) < 1e-12) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar1 = lVar10 + 1;
        if (lVar1 < (this->super_TPZBaseMatrix).fRow) {
          dVar2 = dVar5 * dVar5;
          local_118._8_4_ = SUB84(dVar5,0);
          local_118._0_8_ = dVar5;
          local_118._12_4_ = (int)((ulong)dVar5 >> 0x20);
          local_108._8_4_ = SUB84(dVar2,0);
          local_108._0_8_ = dVar2;
          local_108._12_4_ = (int)((ulong)dVar2 >> 0x20);
          lVar11 = lVar1;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_198,this,lVar11,lVar10);
            lVar7 = 2;
            do {
              auVar12._0_8_ =
                   (double)(&local_198)[lVar7] * (double)local_118._0_8_ -
                   adStack_a0[lVar7 + 6] * local_190;
              auVar12._8_8_ =
                   (&local_190)[lVar7] * (double)local_118._8_8_ - adStack_a0[lVar7 + 7] * local_190
              ;
              auVar12 = divpd(auVar12,local_108);
              *(undefined1 (*) [16])(&local_158 + lVar7) = auVar12;
              lVar7 = lVar7 + 2;
            } while (lVar7 != 8);
            local_150 = local_190 / dVar5;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar11,lVar10,&local_158);
            lVar7 = lVar1;
            if (lVar1 < (this->super_TPZBaseMatrix).fCol) {
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_b0,this,lVar11,lVar7);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_f0,this,lVar10,lVar7);
                local_198 = &PTR__TFad_01835938;
                local_190 = local_a8 - local_150 * local_e8;
                lVar8 = 0;
                do {
                  dVar2 = *(double *)((long)adStack_a0 + lVar8 + 8);
                  dVar3 = *(double *)((long)adStack_148 + lVar8 + 8);
                  dVar4 = *(double *)((long)adStack_e0 + lVar8 + 8);
                  *(double *)((long)adStack_180 + lVar8 + -8) =
                       *(double *)((long)adStack_a0 + lVar8) -
                       (*(double *)((long)adStack_e0 + lVar8) * local_150 +
                       *(double *)((long)adStack_148 + lVar8) * local_e8);
                  *(double *)((long)adStack_180 + lVar8) =
                       dVar2 - (dVar4 * local_150 + dVar3 * local_e8);
                  lVar8 = lVar8 + 0x10;
                } while (lVar8 != 0x30);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar11,lVar7,&local_198);
                lVar7 = lVar7 + 1;
              } while (lVar7 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar10 = lVar1;
      } while (lVar1 != lVar9);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}